

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O2

Wlc_Prs_t * Wlc_PrsStart(char *pFileName,char *pStr)

{
  int iVar1;
  Wlc_Prs_t *pWVar2;
  char *__s;
  size_t sVar3;
  Vec_Int_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Mem_Flex_t *pMVar7;
  
  if ((pFileName != (char *)0x0) && (iVar1 = Extra_FileCheck(pFileName), iVar1 == 0)) {
    return (Wlc_Prs_t *)0x0;
  }
  pWVar2 = (Wlc_Prs_t *)calloc(1,0x2798);
  pWVar2->pFileName = pFileName;
  if (pStr == (char *)0x0) {
    __s = Extra_FileReadContents(pFileName);
  }
  else {
    __s = Abc_UtilStrsav(pStr);
  }
  pWVar2->pBuffer = __s;
  sVar3 = strlen(__s);
  pWVar2->nFileSize = (int)sVar3;
  if (0 < (int)sVar3) {
    iVar1 = (int)((sVar3 & 0xffffffff) / 0x32);
    pVVar4 = Vec_IntAlloc(iVar1);
    pWVar2->vLines = pVVar4;
    pVVar4 = Vec_IntAlloc(iVar1);
    pWVar2->vStarts = pVVar4;
    pVVar4 = Vec_IntAlloc(100);
    pWVar2->vFanins = pVVar4;
    pVVar5 = (Vec_Ptr_t *)malloc(0x10);
    pVVar5->nCap = 1000;
    pVVar5->nSize = 0;
    ppvVar6 = (void **)malloc(8000);
    pVVar5->pArray = ppvVar6;
    pWVar2->vTables = pVVar5;
    pMVar7 = Mem_FlexStart();
    pWVar2->pMemTable = pMVar7;
    return pWVar2;
  }
  __assert_fail("p->nFileSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadVer.c"
                ,0x57,"Wlc_Prs_t *Wlc_PrsStart(char *, char *)");
}

Assistant:

Wlc_Prs_t * Wlc_PrsStart( char * pFileName, char * pStr )
{
    Wlc_Prs_t * p;
    if ( pFileName && !Extra_FileCheck( pFileName ) )
        return NULL;
    p = ABC_CALLOC( Wlc_Prs_t, 1 );
    p->pFileName = pFileName;
    p->pBuffer   = pStr ? Abc_UtilStrsav(pStr) : Extra_FileReadContents( pFileName );
    p->nFileSize = strlen(p->pBuffer);  assert( p->nFileSize > 0 );
    p->vLines    = Vec_IntAlloc( p->nFileSize / 50 );
    p->vStarts   = Vec_IntAlloc( p->nFileSize / 50 );
    p->vFanins   = Vec_IntAlloc( 100 );
    p->vTables   = Vec_PtrAlloc( 1000 );
    p->pMemTable = Mem_FlexStart();
    return p;
}